

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::AdminReport(World *this,Character *from,string *reportee,string *message)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  mapped_type *pmVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  reference ppCVar10;
  size_type sVar11;
  reference ppBVar12;
  Board_Post *this_00;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  time_t tVar16;
  undefined8 uVar17;
  double dVar18;
  allocator<char> local_419;
  key_type local_418;
  Database_Exception *e;
  Database_Result local_3d0;
  allocator<char> local_3a9;
  key_type local_3a8;
  string local_388;
  allocator<char> local_361;
  key_type local_360;
  string local_340;
  string local_320;
  allocator<char> local_2f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278 [32];
  Board_Post *local_258;
  Board_Post *newpost;
  Board *admin_board;
  string chat_log_dump;
  key_type local_220;
  short local_1fc;
  allocator<char> local_1f9;
  undefined1 local_1f8 [4];
  short boardid;
  Character *local_1d8;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  string local_198 [32];
  undefined1 local_178 [8];
  PacketBuilder builder;
  string local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_69;
  key_type local_68;
  string local_48;
  string *local_28;
  string *message_local;
  string *reportee_local;
  Character *from_local;
  World *this_local;
  
  local_28 = message;
  message_local = reportee;
  reportee_local = (string *)from;
  from_local = (Character *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"ChatMaxWidth",&local_69);
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_68);
  iVar3 = util::variant::operator_cast_to_int(pmVar6);
  (**(code **)(*(long *)reportee_local + 0x10))(&local_120);
  util::ucfirst(&local_100,&local_120);
  std::operator+(&local_e0,&local_100,"  reports: ");
  std::operator+(&local_c0,&local_e0,reportee);
  std::operator+(&local_a0,&local_c0,", ");
  iVar4 = util::text_width(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"...",(allocator<char> *)((long)&builder.add_size + 7));
  util::text_cap(&local_48,message,iVar3 - iVar4,&local_140);
  std::__cxx11::string::operator=((string *)message,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&builder.add_size + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  (**(code **)(*(long *)reportee_local + 0x10))();
  lVar7 = std::__cxx11::string::length();
  lVar8 = std::__cxx11::string::length();
  lVar9 = std::__cxx11::string::length();
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_178,PACKET_ADMININTERACT,PACKET_REPLY,lVar9 + 5 + lVar7 + lVar8)
  ;
  std::__cxx11::string::~string(local_198);
  PacketBuilder::AddChar((PacketBuilder *)local_178,2);
  PacketBuilder::AddByte((PacketBuilder *)local_178,0xff);
  (**(code **)(*(long *)reportee_local + 0x10))(&__range1);
  PacketBuilder::AddBreakString((PacketBuilder *)local_178,(string *)&__range1,0xff);
  std::__cxx11::string::~string((string *)&__range1);
  PacketBuilder::AddBreakString((PacketBuilder *)local_178,message,0xff);
  PacketBuilder::AddBreakString((PacketBuilder *)local_178,reportee,0xff);
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                     *)&character), bVar1) {
    ppCVar10 = __gnu_cxx::
               __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
               ::operator*(&__end1);
    local_1d8 = *ppCVar10;
    uVar5 = (**(local_1d8->super_Command_Source)._vptr_Command_Source)();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1f8,"reports",&local_1f9);
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->admin_config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,(key_type *)local_1f8);
    iVar3 = util::variant::operator_cast_to_int(pmVar6);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    if (iVar3 <= (int)(uVar5 & 0xff)) {
      Character::Send(local_1d8,(PacketBuilder *)local_178);
    }
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"AdminBoard",
             (allocator<char> *)(chat_log_dump.field_2._M_local_buf + 0xf));
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_220);
  iVar3 = util::variant::operator_cast_to_int(pmVar6);
  sVar2 = (short)iVar3 + -1;
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)(chat_log_dump.field_2._M_local_buf + 0xf));
  local_1fc = sVar2;
  sVar11 = std::array<Board_*,_8UL>::size(&this->boards);
  if ((ulong)(long)sVar2 < sVar11) {
    std::__cxx11::string::string((string *)&admin_board);
    ppBVar12 = std::array<Board_*,_8UL>::operator[](&this->boards,(long)local_1fc);
    newpost = (Board_Post *)*ppBVar12;
    this_00 = (Board_Post *)operator_new(0x78);
    Board_Post::Board_Post(this_00);
    sVar2 = (short)*(undefined4 *)&newpost->field_0x4 + 1;
    *(short *)&newpost->field_0x4 = sVar2;
    this_00->id = sVar2;
    local_258 = this_00;
    (**(code **)(*(long *)reportee_local + 0x10))(local_278);
    std::__cxx11::string::operator=((string *)&local_258->author,local_278);
    std::__cxx11::string::~string(local_278);
    local_258->author_admin = (uint)(byte)(reportee_local->field_2)._M_local_buf[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8," [Report] ",&local_2f9)
    ;
    (**(code **)(*(long *)reportee_local + 0x10))(&local_340);
    util::ucfirst(&local_320,&local_340);
    std::operator+(&local_2d8,&local_2f8,&local_320);
    std::operator+(&local_2b8,&local_2d8," reports: ");
    std::operator+(&local_298,&local_2b8,reportee);
    std::__cxx11::string::operator=((string *)&local_258->subject,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    std::__cxx11::string::operator=((string *)&local_258->body,(string *)message);
    dVar18 = Timer::GetTime();
    local_258->time = dVar18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"ReportChatLogSize",&local_361);
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_360);
    iVar3 = util::variant::operator_cast_to_int(pmVar6);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
    if (0 < iVar3) {
      Character::GetChatLogDump_abi_cxx11_(&local_388,(Character *)reportee_local);
      std::__cxx11::string::operator=((string *)&admin_board,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::operator+=((string *)&local_258->body,"\r\n\r\n");
      std::__cxx11::string::operator+=((string *)&local_258->body,(string *)&admin_board);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"LogReports",&local_3a9)
    ;
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_3a8);
    bVar1 = util::variant::operator_cast_to_bool(pmVar6);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    if (bVar1) {
      (**(code **)(*(long *)reportee_local + 0x10))(&e);
      uVar13 = std::__cxx11::string::c_str();
      uVar14 = std::__cxx11::string::c_str();
      uVar15 = std::__cxx11::string::c_str();
      tVar16 = time((time_t *)0x0);
      uVar17 = std::__cxx11::string::c_str();
      Database::Query(&local_3d0,&this->db,
                      "INSERT INTO `reports` (`reporter`, `reported`, `reason`, `time`, `chat_log`) VALUES (\'$\', \'$\', \'$\', #, \'$\')"
                      ,uVar13,uVar14,uVar15,(int)tVar16,uVar17);
      Database_Result::~Database_Result(&local_3d0);
      std::__cxx11::string::~string((string *)&e);
    }
    std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::push_front
              ((list<Board_Post_*,_std::allocator<Board_Post_*>_> *)&newpost->author,&local_258);
    sVar11 = std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::size
                       ((list<Board_Post_*,_std::allocator<Board_Post_*>_> *)&newpost->author);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"AdminBoardLimit",&local_419);
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(this->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_418);
    iVar3 = util::variant::operator_cast_to_int(pmVar6);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    if ((ulong)(long)iVar3 < sVar11) {
      std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::pop_back
                ((list<Board_Post_*,_std::allocator<Board_Post_*>_> *)&newpost->author);
    }
    std::__cxx11::string::~string((string *)&admin_board);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_178);
  return;
}

Assistant:

void World::AdminReport(Character *from, std::string reportee, std::string message)
{
	message = util::text_cap(message, static_cast<int>(this->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  reports: " + reportee + ", "));

	PacketBuilder builder(PACKET_ADMININTERACT, PACKET_REPLY, 5 + from->SourceName().length() + message.length() + reportee.length());
	builder.AddChar(2); // message type
	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddBreakString(message);
	builder.AddBreakString(reportee);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceAccess() >= static_cast<int>(this->admin_config["reports"]))
		{
			character->Send(builder);
		}
	}

	short boardid = static_cast<int>(this->config["AdminBoard"]) - 1;

	if (static_cast<std::size_t>(boardid) < this->boards.size())
	{
		std::string chat_log_dump;
		Board *admin_board = this->boards[boardid];

		Board_Post *newpost = new Board_Post;
		newpost->id = ++admin_board->last_id;
		newpost->author = from->SourceName();
		newpost->author_admin = from->admin;
		newpost->subject = std::string(" [Report] ") + util::ucfirst(from->SourceName()) + " reports: " + reportee;
		newpost->body = message;
		newpost->time = Timer::GetTime();

		if (int(this->config["ReportChatLogSize"]) > 0)
		{
			chat_log_dump = from->GetChatLogDump();
			newpost->body += "\r\n\r\n";
			newpost->body += chat_log_dump;
		}

		if (this->config["LogReports"])
		{
			try
			{
				this->db.Query("INSERT INTO `reports` (`reporter`, `reported`, `reason`, `time`, `chat_log`) VALUES ('$', '$', '$', #, '$')",
					from->SourceName().c_str(),
					reportee.c_str(),
					message.c_str(),
					int(std::time(0)),
					chat_log_dump.c_str()
				);
			}
			catch (Database_Exception& e)
			{
				Console::Err("Could not save report to database.");
				Console::Err("%s", e.error());
			}
		}

		admin_board->posts.push_front(newpost);

		if (admin_board->posts.size() > static_cast<std::size_t>(static_cast<int>(this->config["AdminBoardLimit"])))
		{
			admin_board->posts.pop_back();
		}
	}
}